

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall google::protobuf::Descriptor::CopyHeadingTo(Descriptor *this,DescriptorProto *proto)

{
  HasBits<1> *pHVar1;
  ushort *puVar2;
  pointer pcVar3;
  FeatureSet *from;
  bool bVar4;
  void *pvVar5;
  Nonnull<const_char_*> pcVar6;
  MessageOptions *pMVar7;
  MessageOptions *pMVar8;
  FeatureSet *pFVar9;
  Arena *pAVar10;
  uint value;
  long lVar11;
  string_view value_00;
  
  puVar2 = (ushort *)(this->all_names_).payload_;
  value_00._M_len = (ulong)*puVar2;
  (proto->field_0)._impl_._has_bits_.has_bits_[0] =
       (proto->field_0)._impl_._has_bits_.has_bits_[0] | 1;
  value_00._M_str = (char *)((long)puVar2 + ~value_00._M_len);
  pAVar10 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar10 & 1) != 0) {
    pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
  }
  protobuf::internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.name_,value_00,pAVar10);
  if (0 < this->reserved_range_count_) {
    lVar11 = 0;
    do {
      pvVar5 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                         (&(proto->field_0)._impl_.reserved_range_.super_RepeatedPtrFieldBase,
                          Arena::DefaultConstruct<google::protobuf::DescriptorProto_ReservedRange>);
      if (lVar11 < this->reserved_range_count_) {
        pcVar6 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (lVar11,(long)this->reserved_range_count_,
                            "index < reserved_range_count()");
      }
      if (pcVar6 != (Nonnull<const_char_*>)0x0) {
LAB_00f13a13:
        CopyHeadingTo();
        goto LAB_00f13a20;
      }
      *(int *)((long)pvVar5 + 0x18) = this->reserved_ranges_[lVar11].start;
      *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 1;
      if (lVar11 < this->reserved_range_count_) {
        pcVar6 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (lVar11,(long)this->reserved_range_count_,
                            "index < reserved_range_count()");
      }
      if (pcVar6 != (Nonnull<const_char_*>)0x0) {
        CopyHeadingTo();
        goto LAB_00f13a13;
      }
      *(int *)((long)pvVar5 + 0x1c) = this->reserved_ranges_[lVar11].end;
      *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 2;
      lVar11 = lVar11 + 1;
    } while (lVar11 < this->reserved_range_count_);
  }
  if (0 < this->reserved_name_count_) {
    lVar11 = 0;
    do {
      pcVar3 = (this->reserved_names_[lVar11]->_M_dataplus)._M_p;
      pvVar5 = protobuf::internal::RepeatedPtrFieldBase::AddString
                         (&(proto->field_0)._impl_.reserved_name_.super_RepeatedPtrFieldBase);
      std::__cxx11::string::_M_replace((ulong)pvVar5,0,*(char **)((long)pvVar5 + 8),(ulong)pcVar3);
      lVar11 = lVar11 + 1;
    } while (lVar11 < this->reserved_name_count_);
  }
  pMVar8 = this->options_;
  if (pMVar8 != (MessageOptions *)_MessageOptions_default_instance_) {
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 2;
    if ((proto->field_0)._impl_.options_ == (MessageOptions *)0x0) {
      pAVar10 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar10 & 1) != 0) {
        pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
      }
      pMVar7 = (MessageOptions *)Arena::DefaultConstruct<google::protobuf::MessageOptions>(pAVar10);
      (proto->field_0)._impl_.options_ = pMVar7;
    }
    MessageOptions::CopyFrom((proto->field_0)._impl_.options_,pMVar8);
  }
  value = (byte)this->field_0x2 & 3;
  if ((this->field_0x2 & 3) != 0) {
    bVar4 = protobuf::internal::ValidateEnum(value,(uint32_t *)&SymbolVisibility_internal_data_);
    if (!bVar4) {
LAB_00f13a20:
      __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::google::protobuf::SymbolVisibility_internal_data_)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                    ,0x37e4,
                    "void google::protobuf::DescriptorProto::_internal_set_visibility(::google::protobuf::SymbolVisibility)"
                   );
    }
    (proto->field_0)._impl_.visibility_ = value;
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 4;
  }
  from = this->proto_features_;
  if (from == (FeatureSet *)&_FeatureSet_default_instance_) {
    return;
  }
  *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 2;
  if ((proto->field_0)._impl_.options_ == (MessageOptions *)0x0) {
    pAVar10 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar10 & 1) != 0) {
      pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
    }
    pMVar8 = (MessageOptions *)Arena::DefaultConstruct<google::protobuf::MessageOptions>(pAVar10);
    (proto->field_0)._impl_.options_ = pMVar8;
  }
  pMVar8 = (proto->field_0)._impl_.options_;
  pHVar1 = &(pMVar8->field_0)._impl_._has_bits_;
  pHVar1->has_bits_[0] = pHVar1->has_bits_[0] | 1;
  if ((pMVar8->field_0)._impl_.features_ == (FeatureSet *)0x0) {
    pAVar10 = (Arena *)(pMVar8->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar10 & 1) != 0) {
      pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
    }
    pFVar9 = (FeatureSet *)Arena::DefaultConstruct<google::protobuf::FeatureSet>(pAVar10);
    (pMVar8->field_0)._impl_.features_ = pFVar9;
  }
  FeatureSet::CopyFrom((pMVar8->field_0)._impl_.features_,from);
  return;
}

Assistant:

void Descriptor::CopyHeadingTo(DescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < reserved_range_count(); i++) {
    DescriptorProto::ReservedRange* range = proto->add_reserved_range();
    range->set_start(reserved_range(i)->start);
    range->set_end(reserved_range(i)->end);
  }
  for (int i = 0; i < reserved_name_count(); i++) {
    proto->add_reserved_name(reserved_name(i));
  }

  if (&options() != &MessageOptions::default_instance()) {
    *proto->mutable_options() = options();
  }

  if (visibility_keyword() != SymbolVisibility::VISIBILITY_UNSET) {
    proto->set_visibility(visibility_keyword());
  }

  RestoreFeaturesToOptions(proto_features_, proto);
}